

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importedentity.cpp
# Opt level: O0

ImportSourcePtr __thiscall libcellml::ImportedEntity::importSource(ImportedEntity *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ImportSourcePtr IVar1;
  ImportedEntity *this_local;
  
  std::shared_ptr<libcellml::ImportSource>::shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)this,
             *(shared_ptr<libcellml::ImportSource> **)(in_RSI + 8));
  IVar1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ImportSourcePtr)
         IVar1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImportSourcePtr ImportedEntity::importSource() const
{
    return mPimpl->mImportSource;
}